

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3DbStrNDup(sqlite3 *db,char *z,u64 n)

{
  char *__dest;
  
  if ((z != (char *)0x0) && (__dest = (char *)sqlite3DbMallocRawNN(db,n + 1), __dest != (char *)0x0)
     ) {
    memcpy(__dest,z,n);
    __dest[n] = '\0';
    return __dest;
  }
  return (char *)0x0;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrNDup(sqlite3 *db, const char *z, u64 n){
  char *zNew;
  assert( db!=0 );
  assert( z!=0 || n==0 );
  assert( (n&0x7fffffff)==n );
  zNew = z ? sqlite3DbMallocRawNN(db, n+1) : 0;
  if( zNew ){
    memcpy(zNew, z, (size_t)n);
    zNew[n] = 0;
  }
  return zNew;
}